

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.cpp
# Opt level: O3

void __thiscall de::BlockBufferCancelTest::Producer::run(Producer *this)

{
  deUint32 dVar1;
  deBool dVar2;
  size_t in_RCX;
  Random rnd;
  deUint8 tmp [1024];
  deRandom dStack_428;
  undefined1 local_418 [1024];
  
  deRandom_init(&dStack_428,this->m_seed);
  do {
    do {
      dVar1 = deRandom_getUint32(&dStack_428);
      BlockBuffer<unsigned_char>::write(this->m_buffer,(dVar1 & 0x3ff) + 1,local_418,in_RCX);
      dVar2 = deRandom_getBool(&dStack_428);
    } while (dVar2 != 1);
    BlockBuffer<unsigned_char>::flush(this->m_buffer);
  } while( true );
}

Assistant:

void run (void)
	{
		deUint8	tmp[1024];
		Random	rnd(m_seed);

		for (;;)
		{
			int blockSize = rnd.getInt(1, DE_LENGTH_OF_ARRAY(tmp));

			try
			{
				m_buffer->write(blockSize, &tmp[0]);

				if (rnd.getBool())
					m_buffer->flush();
			}
			catch (const BlockBuffer<deUint8>::CanceledException&)
			{
				break;
			}
		}
	}